

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O0

int checkConstant(double *x,int N)

{
  double diff;
  int local_20;
  int cc;
  int i;
  int N_local;
  double *x_local;
  
  local_20 = 1;
  while( true ) {
    if (N + -1 <= local_20) {
      return 1;
    }
    if (0.0 < ABS(x[local_20 + 1] - x[local_20])) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

int checkConstant(double *x, int N) {
    int i, cc;
    double diff;
    cc = 0;

    /// heap buffer overflow fix, since accessing x[i+1] need to 
    /// stop loop at -1 index from end of array as dictated by length defined by N
    for(i = 1; i < N - 1;++i) {
        diff = x[i+1] - x[i];
        if (fabs(diff) > 0) {
            return cc;
        }
    }

    cc = 1;

    return cc;
}